

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::IfcSIUnit(IfcSIUnit *this)

{
  IfcSIUnit *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x90,"IfcSIUnit");
  IfcNamedUnit::IfcNamedUnit(&this->super_IfcNamedUnit,&PTR_construction_vtable_24__00f6a168);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSIUnit,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSIUnit,_2UL> *)
             &(this->super_IfcNamedUnit).field_0x38,&PTR_construction_vtable_24__00f6a188);
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0xf6a100;
  *(undefined8 *)&this->field_0x90 = 0xf6a150;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0xf6a128;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_IfcNamedUnit).field_0x48);
  std::__cxx11::string::string((string *)&this->Name);
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}